

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O1

void gray_render_cubic(PWorker worker,QT_FT_Vector *control1,QT_FT_Vector *control2,QT_FT_Vector *to
                      )

{
  long lVar1;
  int iVar2;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  long in_FS_OFFSET;
  QT_FT_Vector bez_stack [49];
  int local_1c8;
  int iStack_1c4;
  int local_1c0;
  int iStack_1bc;
  int iStack_1b8;
  int iStack_1b4;
  undefined4 local_1b0;
  int local_1ac;
  long local_38;
  int iVar3;
  int iVar4;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_1c8,0xaa,0x188);
  local_1c8 = (*to).x << 2;
  iStack_1c4 = (*to).y << 2;
  iStack_1bc = (*control2).y << 2;
  iStack_1b4 = (*control1).y * 4;
  local_1c0 = (*control2).x << 2;
  iStack_1b8 = (*control1).x << 2;
  local_1b0 = (int)worker->x;
  local_1ac = (int)worker->y;
  lVar1 = worker->max_ey;
  iVar2 = local_1ac >> 8;
  iVar3 = iStack_1bc >> 8;
  iVar4 = iStack_1b4 >> 8;
  if (((((iStack_1c4 >> 8 < lVar1) || (iVar3 < lVar1)) || (iVar4 < lVar1)) || (iVar2 < lVar1)) &&
     (((lVar1 = worker->min_ey, piVar17 = &local_1c8, lVar1 <= iStack_1c4 >> 8 ||
       (piVar17 = &local_1c8, lVar1 <= iVar3)) ||
      ((piVar17 = &local_1c8, lVar1 <= iVar4 || (piVar17 = &local_1c8, lVar1 <= iVar2)))))) {
    do {
      while( true ) {
        iVar2 = piVar17[6];
        iVar3 = piVar17[7];
        lVar5 = (long)*piVar17;
        uVar6 = iVar2 - lVar5;
        lVar1 = (long)piVar17[1];
        uVar7 = iVar3 - lVar1;
        uVar10 = -uVar6;
        if (0 < (long)uVar6) {
          uVar10 = uVar6;
        }
        uVar10 = uVar10 & 0xffffffff;
        uVar8 = -uVar7;
        if (0 < (long)uVar7) {
          uVar8 = uVar7;
        }
        uVar8 = uVar8 & 0xffffffff;
        if (uVar8 < uVar10) {
          uVar8 = uVar8 * 3 >> 3;
        }
        else {
          uVar10 = uVar10 * 3 >> 3;
        }
        uVar8 = uVar8 + uVar10;
        if (uVar8 < 0x800000) break;
LAB_00396a70:
        piVar17[0xc] = iVar2;
        iVar4 = piVar17[2];
        lVar9 = (lVar5 + iVar4) / 2;
        piVar17[2] = (int)lVar9;
        lVar12 = ((long)iVar2 + (long)piVar17[4]) / 2;
        piVar17[10] = (int)lVar12;
        lVar5 = ((long)piVar17[4] + (long)iVar4) / 2;
        lVar9 = (lVar9 + lVar5) / 2;
        piVar17[4] = (int)lVar9;
        lVar5 = (lVar5 + lVar12) / 2;
        piVar17[8] = (int)lVar5;
        lVar5 = lVar5 + lVar9;
        piVar17[6] = (int)((ulong)(lVar5 - (lVar5 >> 0x3f)) >> 1);
        piVar17[0xd] = iVar3;
        iVar2 = piVar17[3];
        lVar5 = (lVar1 + iVar2) / 2;
        piVar17[3] = (int)lVar5;
        lVar12 = ((long)iVar3 + (long)piVar17[5]) / 2;
        piVar17[0xb] = (int)lVar12;
        lVar1 = ((long)piVar17[5] + (long)iVar2) / 2;
        lVar5 = (lVar5 + lVar1) / 2;
        piVar17[5] = (int)lVar5;
        lVar1 = (lVar1 + lVar12) / 2;
        piVar17[9] = (int)lVar1;
        lVar1 = lVar1 + lVar5;
        piVar17[7] = (int)((ulong)(lVar1 - (lVar1 >> 0x3f)) >> 1);
        piVar17 = piVar17 + 6;
      }
      lVar13 = uVar8 * 0x2a;
      lVar11 = piVar17[2] - lVar5;
      lVar9 = piVar17[3] - lVar1;
      lVar14 = lVar11 * uVar7 - lVar9 * uVar6;
      lVar12 = -lVar14;
      if (0 < lVar14) {
        lVar12 = lVar14;
      }
      if (lVar12 != lVar13 && SBORROW8(lVar12,lVar13) == (long)(lVar12 + uVar8 * -0x2a) < 0)
      goto LAB_00396a70;
      lVar15 = piVar17[4] - lVar5;
      lVar16 = piVar17[5] - lVar1;
      lVar14 = lVar15 * uVar7 - lVar16 * uVar6;
      lVar12 = -lVar14;
      if (0 < lVar14) {
        lVar12 = lVar14;
      }
      if (((lVar12 != lVar13 && SBORROW8(lVar12,lVar13) == (long)(lVar12 + uVar8 * -0x2a) < 0) ||
          (lVar11 = (lVar11 - uVar6) * lVar11, lVar9 = (lVar9 - uVar7) * lVar9,
          lVar12 = lVar9 + lVar11, lVar12 != 0 && SCARRY8(lVar9,lVar11) == lVar12 < 0)) ||
         (lVar15 = (lVar15 - uVar6) * lVar15, lVar16 = (lVar16 - uVar7) * lVar16,
         lVar12 = lVar16 + lVar15, lVar12 != 0 && SCARRY8(lVar16,lVar15) == lVar12 < 0))
      goto LAB_00396a70;
      gray_render_line(worker,lVar5,lVar1);
      if (piVar17 == &local_1c8) goto LAB_0039694c;
      piVar17 = piVar17 + -6;
    } while( true );
  }
  worker->x = CONCAT44(-(uint)(local_1c8 < 0),local_1c8);
  (worker->outline).n_contours = iStack_1c4;
  (worker->outline).n_points = -(uint)(iStack_1c4 < 0);
LAB_0039694c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const QT_FT_Vector*  control1,
                              const QT_FT_Vector*  control2,
                              const QT_FT_Vector*  to )
  {
    QT_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    QT_FT_Vector*  arc = bez_stack;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = QT_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = QT_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = QT_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      gray_split_cubic( arc );
      arc += 3;
    }
  }